

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_short,_void,_false>::eval_divide_by_single_limb
          (uintwide_t<48U,_unsigned_short,_void,_false> *this,limb_type_conflict short_denominator,
          unsigned_fast_type u_offset,uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  ulong uVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = 0;
  sVar2 = 0;
  if (u_offset << 0x20 != 0x300000000) {
    lVar5 = (long)(0x300000000 - (u_offset << 0x20)) >> 0x1f;
    iVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uVar4 - iVar3 * (uint)short_denominator) * 0x10000 |
              (uint)*(ushort *)(this + lVar5 + -2);
      uVar1 = (ulong)uVar4 / (ulong)(uint)short_denominator;
      iVar3 = (int)uVar1;
      sVar2 = (short)uVar1;
      *(short *)(this + lVar5 + -2) = sVar2;
      lVar5 = lVar5 + -2;
    } while (lVar5 != 0);
  }
  if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
    *(limb_type_conflict *)(remainder->values).super_array<unsigned_char,_3UL>.elems =
         (short)uVar4 - sVar2 * short_denominator;
    *(undefined4 *)((remainder->values).super_array<unsigned_char,_3UL>.elems + 2) = 0;
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }